

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_debug.c
# Opt level: O3

int cmd_debug_opt(yl_opt *yo,char *cmdline,char ***posv,int *posc)

{
  int iVar1;
  int iVar2;
  char ***argv_p;
  int argc;
  int opt_index;
  option options [2];
  int local_70;
  undefined1 local_6c [4];
  char *local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_70 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0x68;
  local_68 = "help";
  uStack_60 = 0;
  argv_p = &yo->argv;
  iVar1 = parse_cmdline(cmdline,&local_70,argv_p);
  if (iVar1 == 0) {
    iVar2 = getopt_long(local_70,*argv_p,commands[0xb].optstring,&local_68,local_6c);
    iVar1 = _optind;
    if (iVar2 == -1) {
      *posv = *argv_p + _optind;
      *posc = local_70 - iVar1;
      iVar1 = 0;
    }
    else if (iVar2 == 0x68) {
      cmd_debug_help();
      iVar1 = 1;
    }
    else {
      iVar1 = 1;
      yl_log('\x01',"Unknown option.");
    }
  }
  return iVar1;
}

Assistant:

int
cmd_debug_opt(struct yl_opt *yo, const char *cmdline, char ***posv, int *posc)
{
    int rc = 0, argc = 0;
    int opt, opt_index;
    struct option options[] = {
        {"help", no_argument, NULL, 'h'},
        {NULL, 0, NULL, 0}
    };

    if ((rc = parse_cmdline(cmdline, &argc, &yo->argv))) {
        return rc;
    }

    while ((opt = getopt_long(argc, yo->argv, commands[CMD_DEBUG].optstring, options, &opt_index)) != -1) {
        switch (opt) {
        case 'h':
            cmd_debug_help();
            return 1;
        default:
            YLMSG_E("Unknown option.");
            return 1;
        }
    }

    *posv = &yo->argv[optind];
    *posc = argc - optind;

    return 0;
}